

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void totalFinalize(sqlite3_context *context)

{
  Mem *p;
  double val;
  
  p = context->pMem;
  if ((p->flags & 0x2000) == 0) {
    sqlite3VdbeMemReleaseExternal(p);
    p->flags = 1;
    p->z = (char *)0x0;
  }
  else if ((double *)p->z != (double *)0x0) {
    val = *(double *)p->z;
    goto LAB_00175d06;
  }
  val = 0.0;
LAB_00175d06:
  sqlite3VdbeMemSetDouble(&context->s,val);
  return;
}

Assistant:

static void totalFinalize(sqlite3_context *context){
  SumCtx *p;
  p = sqlite3_aggregate_context(context, 0);
  /* (double)0 In case of SQLITE_OMIT_FLOATING_POINT... */
  sqlite3_result_double(context, p ? p->rSum : (double)0);
}